

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

vm_globalvar_t * __thiscall CVmObjTable::create_global_var(CVmObjTable *this)

{
  vm_globalvar_t *pvVar1;
  vm_globalvar_t *pvVar2;
  
  pvVar2 = (vm_globalvar_t *)operator_new(0x20);
  *(undefined8 *)&pvVar2->val = 0;
  (pvVar2->val).val.ptr = (void *)0x0;
  (pvVar2->val).typ = VM_NIL;
  pvVar1 = this->global_var_head_;
  pvVar2->nxt = pvVar1;
  pvVar2->prv = (vm_globalvar_t *)0x0;
  if (pvVar1 != (vm_globalvar_t *)0x0) {
    pvVar1->prv = pvVar2;
  }
  this->global_var_head_ = pvVar2;
  return pvVar2;
}

Assistant:

vm_globalvar_t *CVmObjTable::create_global_var()
{
    vm_globalvar_t *var;

    /* create the new variable */
    var = new vm_globalvar_t();

    /* initialize the variable's value to nil */
    var->val.set_nil();

    /* link it into our list of globals */
    var->nxt = global_var_head_;
    var->prv = 0;
    if (global_var_head_ != 0)
        global_var_head_->prv = var;
    global_var_head_ = var;

    /* return the variable */
    return var;
}